

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDataCollectionCompare(FmsDataCollection lhs,FmsDataCollection rhs)

{
  FmsInt FVar1;
  FmsFieldDescriptor *ppFVar2;
  FmsFieldDescriptor *ppFVar3;
  FmsField *ppFVar4;
  FmsField *ppFVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  FmsInt i;
  FmsInt FVar9;
  FmsInt i_1;
  uint uVar10;
  
  if (lhs != rhs) {
    if (lhs == (FmsDataCollection)0x0) {
      uVar8 = 0xffffffff;
    }
    else if (rhs == (FmsDataCollection)0x0) {
      uVar8 = 0xfffffffe;
    }
    else {
      iVar6 = strcmp(lhs->name,rhs->name);
      iVar7 = FmsMeshCompare(lhs->mesh,rhs->mesh);
      uVar10 = (iVar6 != 0) + 10;
      if (iVar7 == 0) {
        uVar10 = (uint)(iVar6 != 0);
      }
      FVar1 = lhs->num_fds;
      if (FVar1 == rhs->num_fds) {
        ppFVar2 = lhs->fds;
        ppFVar3 = rhs->fds;
        for (FVar9 = 0; FVar1 != FVar9; FVar9 = FVar9 + 1) {
          iVar6 = FmsFieldDescriptorCompare(ppFVar2[FVar9],ppFVar3[FVar9]);
          uVar8 = uVar10 + 100;
          if (iVar6 == 0) {
            uVar8 = uVar10;
          }
          uVar10 = uVar8;
        }
        ppFVar4 = lhs->fields;
        ppFVar5 = rhs->fields;
        for (FVar9 = 0; FVar1 != FVar9; FVar9 = FVar9 + 1) {
          iVar6 = FmsFieldCompare(ppFVar4[FVar9],ppFVar5[FVar9]);
          uVar8 = uVar10 + 1000;
          if (iVar6 == 0) {
            uVar8 = uVar10;
          }
          uVar10 = uVar8;
        }
      }
      else {
        uVar10 = uVar10 + 0x44c;
      }
      iVar6 = FmsMetaDataCompare(lhs->mdata,rhs->mdata);
      uVar8 = uVar10 + 10000;
      if (iVar6 == 0) {
        uVar8 = uVar10;
      }
    }
    return uVar8;
  }
  return 0;
}

Assistant:

int FmsDataCollectionCompare(FmsDataCollection lhs, FmsDataCollection rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  // Compare names
  int diff = 0;
  const char *lhs_name = NULL;
  const char *rhs_name = NULL;
  FmsDataCollectionGetName(lhs, &lhs_name);
  FmsDataCollectionGetName(rhs, &rhs_name);
  if(strcmp(lhs_name, rhs_name)) {
    diff += 1;
  }

  // Compare mesh topologies
  FmsMesh lhs_mesh = NULL, rhs_mesh = NULL;
  FmsDataCollectionGetMesh(lhs, &lhs_mesh);
  FmsDataCollectionGetMesh(rhs, &rhs_mesh);
  if(FmsMeshCompare(lhs_mesh, rhs_mesh)) {
    diff += 10;
  }

  // Compare FieldDescriptors
  FmsFieldDescriptor *lhs_fds = NULL, *rhs_fds = NULL;
  FmsInt lhs_nfds = 0, rhs_nfds = -1;
  FmsDataCollectionGetFieldDescriptors(lhs, &lhs_fds, &lhs_nfds);
  FmsDataCollectionGetFieldDescriptors(rhs, &rhs_fds, &rhs_nfds);
  if(lhs_nfds != rhs_nfds) {
    diff += 100;
  } else {
    for(FmsInt i = 0; i < lhs_nfds; i++) {
      if(FmsFieldDescriptorCompare(lhs_fds[i], rhs_fds[i])) {
        diff += 100;
      }
    }
  }

  // Compare Fields
  FmsField *lhs_fields = NULL, *rhs_fields = NULL;
  FmsInt lhs_nfields = 0, rhs_nfields = -1;
  FmsDataCollectionGetFields(lhs, &lhs_fields, &lhs_nfields);
  FmsDataCollectionGetFields(rhs, &rhs_fields, &rhs_nfields);
  if(lhs_nfds != rhs_nfds) {
    diff += 1000;
  } else {
    for(FmsInt i = 0; i < lhs_nfds; i++) {
      if(FmsFieldCompare(lhs_fields[i], rhs_fields[i])) {
        diff += 1000;
      }
    }
  }

  // Compare MetaData
  FmsMetaData lhs_md = NULL, rhs_md = NULL;
  FmsDataCollectionGetMetaData(lhs, &lhs_md);
  FmsDataCollectionGetMetaData(rhs, &rhs_md);
  if(FmsMetaDataCompare(lhs_md, rhs_md)) {
    diff += 10000;
  }
  return diff;
}